

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.hpp
# Opt level: O1

void __thiscall
duckdb_jaro_winkler::CachedJaroSimilarity<char>::~CachedJaroSimilarity
          (CachedJaroSimilarity<char> *this)

{
  pointer puVar1;
  pointer pBVar2;
  pointer pcVar3;
  
  puVar1 = (this->PM).m_extendedAscii.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pBVar2 = (this->PM).m_map.
           super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2);
  }
  pcVar3 = (this->s1)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->s1).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

CachedJaroSimilarity(InputIt1 first1, InputIt1 last1) : s1(first1, last1), PM(first1, last1)
    {}